

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_parameter_expression.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundParameterExpression::Copy(BoundParameterExpression *this)

{
  pointer pBVar1;
  Expression *in_RSI;
  unique_ptr<duckdb::BoundParameterExpression,_std::default_delete<duckdb::BoundParameterExpression>,_true>
  local_20;
  
  make_uniq<duckdb::BoundParameterExpression,std::__cxx11::string_const&>
            ((duckdb *)&local_20,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 1));
  pBVar1 = unique_ptr<duckdb::BoundParameterExpression,_std::default_delete<duckdb::BoundParameterExpression>,_true>
           ::operator->(&local_20);
  shared_ptr<duckdb::BoundParameterData,_true>::operator=
            (&pBVar1->parameter_data,
             (shared_ptr<duckdb::BoundParameterData,_true> *)
             &in_RSI[1].super_BaseExpression.alias.field_2);
  pBVar1 = unique_ptr<duckdb::BoundParameterExpression,_std::default_delete<duckdb::BoundParameterExpression>,_true>
           ::operator->(&local_20);
  LogicalType::operator=(&(pBVar1->super_Expression).return_type,&in_RSI->return_type);
  pBVar1 = unique_ptr<duckdb::BoundParameterExpression,_std::default_delete<duckdb::BoundParameterExpression>,_true>
           ::operator->(&local_20);
  Expression::CopyProperties(&pBVar1->super_Expression,in_RSI);
  (this->super_Expression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)
       local_20.
       super_unique_ptr<duckdb::BoundParameterExpression,_std::default_delete<duckdb::BoundParameterExpression>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::BoundParameterExpression,_std::default_delete<duckdb::BoundParameterExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundParameterExpression_*,_std::default_delete<duckdb::BoundParameterExpression>_>
       .super__Head_base<0UL,_duckdb::BoundParameterExpression_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BoundParameterExpression::Copy() const {
	auto result = make_uniq<BoundParameterExpression>(identifier);
	result->parameter_data = parameter_data;
	result->return_type = return_type;
	result->CopyProperties(*this);
	return std::move(result);
}